

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_ZeroOrMoreArguments_Test::~OptionParser_ZeroOrMoreArguments_Test
          (OptionParser_ZeroOrMoreArguments_Test *this)

{
  OptionParser_ZeroOrMoreArguments_Test *this_local;
  
  ~OptionParser_ZeroOrMoreArguments_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OptionParser, ZeroOrMoreArguments) {
  std::string argument;
  OptionParser parser("prog", "desc");
  parser.AddArgument("arg", OptionParser::ArgumentCount::ZeroOrMore,
                     [&](const char* arg) { argument += arg; });

  const char* args_none[] = {"prog name"};
  parser.Parse(1, const_cast<char**>(args_none));
  EXPECT_EQ("", argument);

  const char* args_many[] = {"prog name", "hello", "goodbye"};
  parser.Parse(3, const_cast<char**>(args_many));
  EXPECT_EQ("hellogoodbye", argument);
}